

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall
spectest::CommandRunner::OnModuleCommand(CommandRunner *this,ModuleCommand *command)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t line_number;
  pointer pcVar2;
  string_view module_filename;
  Ref *pRVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
  *this_00;
  Enum EVar4;
  RefVec imports;
  Errors errors;
  Ptr local_d0;
  Ptr local_b8;
  Ptr local_a0;
  RefVec local_88;
  string local_68;
  Errors local_48;
  
  local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  module_filename.data_ = (command->filename)._M_dataplus._M_p;
  module_filename.size_ = (command->filename)._M_string_length;
  ReadModule(&local_d0,this,module_filename,&local_48);
  paVar1 = &local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)paVar1;
  wabt::FormatErrorsToFile
            (&local_48,Binary,(LexerSourceLineFinder *)0x0,_stderr,&local_68,Never,0x50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_d0.obj_ == (Module *)0x0) {
    PrintError(this,(command->super_CommandMixin<(wabt::CommandType)0>).super_Command.line,
               "error reading module: \"%s\"",(command->filename)._M_dataplus._M_p);
    EVar4 = Error;
  }
  else {
    local_88.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    PopulateImports(this,&local_d0,&local_88);
    local_b8.root_index_ = 0;
    local_b8.obj_ = (Trap *)0x0;
    local_b8.store_ = (Store *)0x0;
    if (local_d0.store_ == (Store *)0x0) {
      pRVar3 = (Ref *)&wabt::interp::Ref::Null;
    }
    else {
      pRVar3 = wabt::interp::FreeList<wabt::interp::Ref>::Get
                         (&(local_d0.store_)->roots_,local_d0.root_index_);
    }
    wabt::interp::Instance::Instantiate
              (&local_a0,&this->store_,(Ref)pRVar3->index,&local_88,&local_b8);
    if (local_b8.obj_ == (Trap *)0x0) {
      PopulateExports(this,&local_a0,&this->last_instance_);
      EVar4 = Ok;
      if ((command->name)._M_string_length != 0) {
        this_00 = &std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>_>_>_>
                   ::operator[](&this->instances_,&command->name)->_M_t;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
        ::operator=(this_00,&(this->last_instance_)._M_t);
        EVar4 = Ok;
      }
    }
    else {
      if (local_a0.obj_ != (Instance *)0x0) {
        __assert_fail("!instance",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc"
                      ,0x5c2,
                      "wabt::Result spectest::CommandRunner::OnModuleCommand(const ModuleCommand *)"
                     );
      }
      line_number = (command->super_CommandMixin<(wabt::CommandType)0>).super_Command.line;
      pcVar2 = ((local_b8.obj_)->message_)._M_dataplus._M_p;
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar2,pcVar2 + ((local_b8.obj_)->message_)._M_string_length);
      PrintError(this,line_number,"error instantiating module: \"%s\"",local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      EVar4 = Error;
    }
    if (local_a0.obj_ != (Instance *)0x0) {
      wabt::interp::Store::DeleteRoot(local_a0.store_,local_a0.root_index_);
    }
    if (local_b8.obj_ != (Trap *)0x0) {
      wabt::interp::Store::DeleteRoot(local_b8.store_,local_b8.root_index_);
    }
    if (local_88.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_d0.obj_ != (Module *)0x0) {
    wabt::interp::Store::DeleteRoot(local_d0.store_,local_d0.root_index_);
  }
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_48);
  return (Result)EVar4;
}

Assistant:

wabt::Result CommandRunner::OnModuleCommand(const ModuleCommand* command) {
  Errors errors;
  auto module = ReadModule(command->filename, &errors);
  FormatErrorsToFile(errors, Location::Type::Binary);

  if (!module) {
    PrintError(command->line, "error reading module: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  RefVec imports;
  PopulateImports(module, &imports);

  Trap::Ptr trap;
  auto instance = Instance::Instantiate(store_, module.ref(), imports, &trap);
  if (trap) {
    assert(!instance);
    PrintError(command->line, "error instantiating module: \"%s\"",
               trap->message().c_str());
    return wabt::Result::Error;
  }

  PopulateExports(instance, &last_instance_);
  if (!command->name.empty()) {
    instances_[command->name] = last_instance_;
  }

  return wabt::Result::Ok;
}